

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

locateresult __thiscall
tetgenmesh::locate(tetgenmesh *this,point searchpt,triface *searchtet,int chkencflag)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  tetrahedron *pppdVar8;
  tetrahedron pc;
  int *piVar9;
  tetrahedron ppdVar10;
  tetrahedron pb;
  tetrahedron pc_00;
  double dVar11;
  double dVar12;
  double dVar13;
  
  pppdVar8 = searchtet->tet;
  if (pppdVar8 == (tetrahedron *)0x0) {
    pppdVar8 = (this->recenttet).tet;
    searchtet->tet = pppdVar8;
  }
  if (pppdVar8[7] == (tetrahedron)this->dummypoint) {
    searchtet->tet = (tetrahedron *)((ulong)pppdVar8[3] & 0xfffffffffffffff0);
  }
  searchtet->ver = 0;
  iVar3 = 0;
  do {
    pppdVar8 = searchtet->tet;
    ppdVar10 = pppdVar8[orgpivot[iVar3]];
    pb = pppdVar8[destpivot[iVar3]];
    pc = pppdVar8[apexpivot[iVar3]];
    dVar11 = orient3d((double *)ppdVar10,(double *)pb,(double *)pc,searchpt);
    iVar1 = searchtet->ver;
    iVar3 = iVar1;
    if (dVar11 < 0.0) break;
    iVar3 = iVar1 + 1;
    searchtet->ver = iVar3;
  } while (iVar1 < 3);
  if (iVar3 == 4) {
    puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
    puts("  the message above, your input data set, and the exact");
    puts("  command line you used to run this program, thank you.");
    exit(2);
  }
  lVar5 = (long)iVar3;
  pc_00 = searchtet->tet[oppopivot[lVar5]];
  do {
    if (pc_00 == (tetrahedron)searchpt) {
      iVar3 = esymtbl[lVar5];
      searchtet->ver = iVar3;
      searchtet->ver = eprevtbl[iVar3];
      return ONVERTEX;
    }
    dVar11 = orient3d((double *)pb,(double *)pc,(double *)pc_00,searchpt);
    dVar12 = orient3d((double *)pc,(double *)ppdVar10,(double *)pc_00,searchpt);
    dVar13 = orient3d((double *)ppdVar10,(double *)pb,(double *)pc_00,searchpt);
    if (0.0 <= dVar11) {
      if (0.0 <= dVar12) {
        if (0.0 <= dVar13) {
          if ((dVar11 != 0.0) || (NAN(dVar11))) {
            if ((dVar12 != 0.0) || (NAN(dVar12))) {
              if ((dVar13 != 0.0) || (NAN(dVar13))) {
                return INTETRAHEDRON;
              }
              searchtet->ver = esymtbl[searchtet->ver];
            }
            else {
              lVar5 = (long)eprevesymtbl[searchtet->ver];
              searchtet->ver = eprevesymtbl[searchtet->ver];
              if ((dVar13 == 0.0) && (!NAN(dVar13))) {
                piVar6 = eprevtbl;
                goto LAB_0012182d;
              }
            }
          }
          else {
            lVar5 = (long)enextesymtbl[searchtet->ver];
            searchtet->ver = enextesymtbl[searchtet->ver];
            if ((dVar12 == 0.0) && (!NAN(dVar12))) {
              searchtet->ver = eprevtbl[lVar5];
              return (dVar13 == 0.0) + ONEDGE;
            }
            if ((dVar13 == 0.0) && (!NAN(dVar13))) {
              piVar6 = enexttbl;
LAB_0012182d:
              searchtet->ver = piVar6[lVar5];
              return ONEDGE;
            }
          }
          return ONFACE;
        }
      }
      else if ((0.0 <= dVar13) ||
              (uVar7 = (this->randomseed * 0x556 + 0x24d69) % 0xae529, this->randomseed = uVar7,
              (uVar7 & 1) != 0)) {
LAB_001216c8:
        piVar6 = eprevesymtbl;
        goto LAB_001216cf;
      }
LAB_001216b3:
      piVar6 = esymtbl;
    }
    else if (0.0 <= dVar12) {
      piVar6 = enextesymtbl;
      if (dVar13 < 0.0) {
        uVar7 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
        this->randomseed = uVar7;
        piVar6 = enextesymtbl;
        if ((uVar7 & 1) == 0) goto LAB_001216b3;
      }
    }
    else {
      uVar7 = (this->randomseed * 0x556 + 0x24d69) % 0xae529;
      this->randomseed = uVar7;
      if (0.0 <= dVar13) {
        piVar6 = enextesymtbl;
        if ((uVar7 & 1) == 0) goto LAB_001216c8;
      }
      else {
        iVar3 = (int)(uVar7 / 3);
        piVar9 = eprevesymtbl;
        if ((int)uVar7 + iVar3 * -3 != 1) {
          piVar9 = esymtbl;
        }
        piVar6 = enextesymtbl;
        if ((int)uVar7 != iVar3 * 3) {
          piVar6 = piVar9;
        }
      }
    }
LAB_001216cf:
    uVar2 = piVar6[searchtet->ver];
    searchtet->ver = uVar2;
    if (((chkencflag != 0) && (ppdVar10 = searchtet->tet[9], ppdVar10 != (tetrahedron)0x0)) &&
       (ppdVar10[uVar2 & 3] != (double *)0x0)) {
      return ENCSUBFACE;
    }
    ppdVar10 = searchtet->tet[uVar2 & 3];
    uVar4 = (uint)ppdVar10 & 0xf;
    searchtet->ver = uVar4;
    pppdVar8 = (tetrahedron *)((ulong)ppdVar10 & 0xfffffffffffffff0);
    searchtet->tet = pppdVar8;
    lVar5 = (long)fsymtbl[(int)uVar2][uVar4];
    searchtet->ver = fsymtbl[(int)uVar2][uVar4];
    pc_00 = pppdVar8[oppopivot[lVar5]];
    if (pc_00 == (tetrahedron)this->dummypoint) {
      return OUTSIDE;
    }
    ppdVar10 = pppdVar8[orgpivot[lVar5]];
    pb = pppdVar8[destpivot[lVar5]];
    pc = pppdVar8[apexpivot[lVar5]];
  } while( true );
}

Assistant:

enum tetgenmesh::locateresult 
  tetgenmesh::locate(point searchpt, triface* searchtet, int chkencflag)
{
  point torg, tdest, tapex, toppo;
  enum {ORGMOVE, DESTMOVE, APEXMOVE} nextmove;
  REAL ori, oriorg, oridest, oriapex;
  enum locateresult loc = OUTSIDE;
  int t1ver;
  int s;

  if (searchtet->tet == NULL) {
    // A null tet. Choose the recenttet as the starting tet.
    searchtet->tet = recenttet.tet;
  }

  // Check if we are in the outside of the convex hull.
  if (ishulltet(*searchtet)) {
    // Get its adjacent tet (inside the hull).
    searchtet->ver = 3;
    fsymself(*searchtet);
  }

  // Let searchtet be the face such that 'searchpt' lies above to it.
  for (searchtet->ver = 0; searchtet->ver < 4; searchtet->ver++) {
    torg = org(*searchtet);
    tdest = dest(*searchtet);
    tapex = apex(*searchtet);
    ori = orient3d(torg, tdest, tapex, searchpt); 
    if (ori < 0.0) break;
  }
  if (searchtet->ver == 4) {
    terminatetetgen(this, 2);
  }

  // Walk through tetrahedra to locate the point.
  while (true) {

    toppo = oppo(*searchtet);
    
    // Check if the vertex is we seek.
    if (toppo == searchpt) {
      // Adjust the origin of searchtet to be searchpt.
      esymself(*searchtet);
      eprevself(*searchtet);
      loc = ONVERTEX; // return ONVERTEX;
      break;
    }

    // We enter from one of serarchtet's faces, which face do we exit?
    oriorg = orient3d(tdest, tapex, toppo, searchpt); 
    oridest = orient3d(tapex, torg, toppo, searchpt);
    oriapex = orient3d(torg, tdest, toppo, searchpt);

    // Now decide which face to move. It is possible there are more than one
    //   faces are viable moves. If so, randomly choose one.
    if (oriorg < 0) {
      if (oridest < 0) {
        if (oriapex < 0) {
          // All three faces are possible.
          s = randomnation(3); // 's' is in {0,1,2}.
          if (s == 0) {
            nextmove = ORGMOVE;
          } else if (s == 1) {
            nextmove = DESTMOVE;
          } else {
            nextmove = APEXMOVE;
          }
        } else {
          // Two faces, opposite to origin and destination, are viable.
          //s = randomnation(2); // 's' is in {0,1}.
          if (randomnation(2)) {
            nextmove = ORGMOVE;
          } else {
            nextmove = DESTMOVE;
          }
        }
      } else {
        if (oriapex < 0) {
          // Two faces, opposite to origin and apex, are viable.
          //s = randomnation(2); // 's' is in {0,1}.
          if (randomnation(2)) {
            nextmove = ORGMOVE;
          } else {
            nextmove = APEXMOVE;
          }
        } else {
          // Only the face opposite to origin is viable.
          nextmove = ORGMOVE;
        }
      }
    } else {
      if (oridest < 0) {
        if (oriapex < 0) {
          // Two faces, opposite to destination and apex, are viable.
          //s = randomnation(2); // 's' is in {0,1}.
          if (randomnation(2)) {
            nextmove = DESTMOVE;
          } else {
            nextmove = APEXMOVE;
          }
        } else {
          // Only the face opposite to destination is viable.
          nextmove = DESTMOVE;
        }
      } else {
        if (oriapex < 0) {
          // Only the face opposite to apex is viable.
          nextmove = APEXMOVE;
        } else {
          // The point we seek must be on the boundary of or inside this
          //   tetrahedron. Check for boundary cases.
          if (oriorg == 0) {
            // Go to the face opposite to origin.
            enextesymself(*searchtet);
            if (oridest == 0) {
              eprevself(*searchtet); // edge oppo->apex
              if (oriapex == 0) {
                // oppo is duplicated with p.
                loc = ONVERTEX; // return ONVERTEX;
                break;
              }
              loc = ONEDGE; // return ONEDGE;
              break;
            }
            if (oriapex == 0) {
              enextself(*searchtet); // edge dest->oppo
              loc = ONEDGE; // return ONEDGE;
              break;
            }
            loc = ONFACE; // return ONFACE;
            break;
          }
          if (oridest == 0) {
            // Go to the face opposite to destination.
            eprevesymself(*searchtet);
            if (oriapex == 0) {
              eprevself(*searchtet); // edge oppo->org
              loc = ONEDGE; // return ONEDGE;
              break;
            }
            loc = ONFACE; // return ONFACE;
            break;
          }
          if (oriapex == 0) {
            // Go to the face opposite to apex
            esymself(*searchtet);
            loc = ONFACE; // return ONFACE;
            break;
          }
          loc = INTETRAHEDRON; // return INTETRAHEDRON;
          break;
        }
      }
    }
    
    // Move to the selected face.
    if (nextmove == ORGMOVE) {
      enextesymself(*searchtet);
    } else if (nextmove == DESTMOVE) {
      eprevesymself(*searchtet);
    } else {
      esymself(*searchtet);
    }
    if (chkencflag) {
      // Check if we are walking across a subface.
      if (issubface(*searchtet)) {
        loc = ENCSUBFACE;
        break;
      }
    }
    // Move to the adjacent tetrahedron (maybe a hull tetrahedron).
    fsymself(*searchtet);
    if (oppo(*searchtet) == dummypoint) {
      loc = OUTSIDE; // return OUTSIDE;
      break;
    }

    // Retreat the three vertices of the base face.
    torg = org(*searchtet);
    tdest = dest(*searchtet);
    tapex = apex(*searchtet);

  } // while (true)

  return loc;
}